

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

uint64_t __thiscall
flatbuffers::BinaryAnnotator::BuildHeader(BinaryAnnotator *this,uint64_t header_offset)

{
  uint8_t *puVar1;
  int iVar2;
  Optional<unsigned_int> OVar3;
  Object *this_00;
  String *this_01;
  uint64_t offset;
  uint64_t i;
  uint64_t uVar4;
  uint64_t points_to_offset;
  Optional<unsigned_long> OVar5;
  allocator<char> local_419;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_3f8;
  string local_3e0 [32];
  string local_3c0 [32];
  BinaryRegion local_3a0;
  undefined1 local_300 [8];
  _Alloc_hider local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  BinaryRegionCommentType local_2d8;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  size_t local_290;
  undefined1 local_288 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  BinaryRegionCommentType local_260;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  size_t local_218;
  BinaryRegionComment local_210;
  BinaryRegionComment local_198;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  regions.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  regions.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  regions.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offset = header_offset;
  if (this->is_size_prefixed_ == true) {
    local_2d0._M_p = (pointer)&local_2c0;
    local_300._0_4_ = OK;
    local_2f0 = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2c8 = 0;
    local_2c0._M_local_buf[0] = '\0';
    local_2b0._M_p = (pointer)&local_2a0;
    local_2a8 = 0;
    local_2a0._M_local_buf[0] = '\0';
    local_290 = 0;
    local_2d8 = SizePrefix;
    local_2f8._M_p = (pointer)&local_2e8;
    OVar5 = ReadScalar<unsigned_long>(this,header_offset);
    if (this->binary_length_ <
        OVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload) {
      OVar3 = ReadScalar<unsigned_int>(this,header_offset);
      if (this->binary_length_ <
          ((ulong)OVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0xffffffff)) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_3c0,"",(allocator<char> *)&local_3a0);
        local_300._0_4_ = ERROR;
        std::__cxx11::string::_M_assign((string *)&local_2f8);
        std::__cxx11::string::~string(local_3c0);
      }
      else {
        BinaryRegionComment::BinaryRegionComment(&local_120,(BinaryRegionComment *)local_300);
        anon_unknown_45::MakeBinaryRegion(&local_3a0,header_offset,4,Uint32,0,0,&local_120);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&regions,&local_3a0);
        BinaryRegionComment::~BinaryRegionComment(&local_3a0.comment);
        BinaryRegionComment::~BinaryRegionComment(&local_120);
        offset = header_offset + 4;
      }
    }
    else {
      BinaryRegionComment::BinaryRegionComment(&local_a8,(BinaryRegionComment *)local_300);
      anon_unknown_45::MakeBinaryRegion(&local_3a0,header_offset,8,Uint64,0,0,&local_a8);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&regions,&local_3a0);
      BinaryRegionComment::~BinaryRegionComment(&local_3a0.comment);
      BinaryRegionComment::~BinaryRegionComment(&local_a8);
      offset = header_offset + 8;
    }
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_300);
  }
  OVar3 = ReadScalar<unsigned_int>(this,offset);
  if (((ulong)OVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    points_to_offset = 0xffffffffffffffff;
  }
  else {
    local_2d0._M_p = (pointer)&local_2c0;
    local_300._0_4_ = OK;
    local_2f0 = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2c8 = 0;
    local_2c0._M_local_buf[0] = '\0';
    local_2b0._M_p = (pointer)&local_2a0;
    local_2a8 = 0;
    local_2a0._M_local_buf[0] = '\0';
    local_290 = 0;
    local_2d8 = RootTableOffset;
    local_2f8._M_p = (pointer)&local_2e8;
    this_00 = RootTable(this);
    this_01 = reflection::Object::name(this_00);
    String::str_abi_cxx11_((string *)&local_3a0,this_01);
    points_to_offset =
         ((ulong)OVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int> & 0xffffffff) + offset;
    std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    if (this->binary_length_ <= points_to_offset) {
      std::__cxx11::string::string<std::allocator<char>>(local_3e0,"",(allocator<char> *)&local_3a0)
      ;
      local_300._0_4_ = ERROR_OFFSET_OUT_OF_BINARY;
      std::__cxx11::string::_M_assign((string *)&local_2f8);
      std::__cxx11::string::~string(local_3e0);
    }
    BinaryRegionComment::BinaryRegionComment(&local_198,(BinaryRegionComment *)local_300);
    anon_unknown_45::MakeBinaryRegion(&local_3a0,offset,4,UOffset,0,points_to_offset,&local_198);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&regions,&local_3a0);
    BinaryRegionComment::~BinaryRegionComment(&local_3a0.comment);
    BinaryRegionComment::~BinaryRegionComment(&local_198);
    if (offset + 7 < this->binary_length_ && 4 < this->binary_length_) {
      puVar1 = this->binary_;
      uVar4 = offset + 4;
      do {
        if (offset + 8 <= uVar4) {
          local_288._8_8_ = &local_270;
          local_288._0_4_ = OK;
          local_288._16_8_ = 0;
          local_270._M_local_buf[0] = '\0';
          local_258._M_p = (pointer)&local_248;
          local_250 = 0;
          local_248._M_local_buf[0] = '\0';
          local_238._M_p = (pointer)&local_228;
          local_230 = 0;
          local_228._M_local_buf[0] = '\0';
          local_218 = 0;
          local_260 = FileIdentifier;
          BinaryRegionComment::BinaryRegionComment(&local_210,(BinaryRegionComment *)local_288);
          anon_unknown_45::MakeBinaryRegion(&local_3a0,offset + 4,4,Char,4,0,&local_210);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          emplace_back<flatbuffers::BinaryRegion>(&regions,&local_3a0);
          BinaryRegionComment::~BinaryRegionComment(&local_3a0.comment);
          BinaryRegionComment::~BinaryRegionComment(&local_210);
          BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_288);
          break;
        }
        iVar2 = isprint((uint)puVar1[uVar4]);
        uVar4 = uVar4 + 1;
      } while (iVar2 != 0);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_288,"",&local_419);
    local_3f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_3f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_3f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_45::MakeBinarySection
              ((BinarySection *)&local_3a0,(string *)local_288,Header,&local_3f8);
    AddSection(this,header_offset,(BinarySection *)&local_3a0);
    BinarySection::~BinarySection((BinarySection *)&local_3a0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_3f8);
    std::__cxx11::string::~string((string *)local_288);
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_300);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&regions);
  return points_to_offset;
}

Assistant:

uint64_t BinaryAnnotator::BuildHeader(const uint64_t header_offset) {
  uint64_t offset = header_offset;
  std::vector<BinaryRegion> regions;

  // If this binary is a size prefixed one, attempt to parse the size.
  if (is_size_prefixed_) {
    BinaryRegionComment prefix_length_comment;
    prefix_length_comment.type = BinaryRegionCommentType::SizePrefix;

    bool has_prefix_value = false;
    const auto prefix_length = ReadScalar<uoffset64_t>(offset);
    if (*prefix_length <= binary_length_) {
      regions.push_back(MakeBinaryRegion(offset, sizeof(uoffset64_t),
                                         BinaryRegionType::Uint64, 0, 0,
                                         prefix_length_comment));
      offset += sizeof(uoffset64_t);
      has_prefix_value = true;
    }

    if (!has_prefix_value) {
      const auto prefix_length = ReadScalar<uoffset_t>(offset);
      if (*prefix_length <= binary_length_) {
        regions.push_back(MakeBinaryRegion(offset, sizeof(uoffset_t),
                                           BinaryRegionType::Uint32, 0, 0,
                                           prefix_length_comment));
        offset += sizeof(uoffset_t);
        has_prefix_value = true;
      }
    }

    if (!has_prefix_value) {
      SetError(prefix_length_comment, BinaryRegionStatus::ERROR);
    }
  }

  const auto root_table_offset = ReadScalar<uint32_t>(offset);

  if (!root_table_offset.has_value()) {
    // This shouldn't occur, since we validate the min size of the buffer
    // before. But for completion sake, we shouldn't read passed the binary end.
    return std::numeric_limits<uint64_t>::max();
  }

  const auto root_table_loc = offset + *root_table_offset;

  BinaryRegionComment root_offset_comment;
  root_offset_comment.type = BinaryRegionCommentType::RootTableOffset;
  root_offset_comment.name = RootTable()->name()->str();

  if (!IsValidOffset(root_table_loc)) {
    SetError(root_offset_comment,
             BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
  }

  regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                     BinaryRegionType::UOffset, 0,
                                     root_table_loc, root_offset_comment));
  offset += sizeof(uint32_t);

  if (IsValidRead(offset, flatbuffers::kFileIdentifierLength) &&
      IsPrintableRegion(offset, flatbuffers::kFileIdentifierLength, binary_)) {
    BinaryRegionComment comment;
    comment.type = BinaryRegionCommentType::FileIdentifier;
    // Check if the file identifier region has non-zero data, and assume its
    // the file identifier. Otherwise, it will get filled in with padding
    // later.
    regions.push_back(MakeBinaryRegion(
        offset, flatbuffers::kFileIdentifierLength * sizeof(uint8_t),
        BinaryRegionType::Char, flatbuffers::kFileIdentifierLength, 0,
        comment));
  }

  AddSection(header_offset, MakeBinarySection("", BinarySectionType::Header,
                                              std::move(regions)));

  return root_table_loc;
}